

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

Element QCborContainerPrivate::elementFromValue(QCborValue *value)

{
  Element EVar1;
  anon_union_8_2_4ee71171_for_Element_0 *paVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  Element e;
  undefined4 in_stack_ffffffffffffffc8;
  ValueFlag in_stack_ffffffffffffffcc;
  Element *in_stack_ffffffffffffffd0;
  undefined4 local_20;
  undefined1 local_1c [4];
  anon_union_8_2_4ee71171_for_Element_0 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI < 0) || (in_RDI[1] == 0)) {
    local_18 = (anon_union_8_2_4ee71171_for_Element_0)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    memset(local_1c,0,4);
    QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x47a0b5);
    QtCbor::Element::Element
              (in_stack_ffffffffffffffd0,
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),Integer,
               (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0));
    local_18.value = *in_RDI;
    local_10 = (undefined1 *)CONCAT44(local_10._4_4_,(int)in_RDI[2]);
    if (in_RDI[1] != 0) {
      local_18 = (anon_union_8_2_4ee71171_for_Element_0)
                 ((anon_union_8_2_4ee71171_for_Element_0 *)(in_RDI + 1))->value;
      QFlags<QtCbor::Element::ValueFlag>::QFlags
                ((QFlags<QtCbor::Element::ValueFlag> *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffcc);
      local_10 = (undefined1 *)CONCAT44(local_20,(undefined4)local_10);
    }
  }
  else {
    paVar2 = &QList<QtCbor::Element>::at
                        ((QList<QtCbor::Element> *)in_stack_ffffffffffffffd0,
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))->field_0;
    local_18 = (anon_union_8_2_4ee71171_for_Element_0)paVar2->value;
    local_10 = (undefined1 *)paVar2[1].value;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  EVar1.type = (undefined4)local_10;
  EVar1.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
  super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
       (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
       (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)local_10._4_4_;
  EVar1.field_0.value = local_18.value;
  return EVar1;
}

Assistant:

static QtCbor::Element elementFromValue(const QCborValue &value)
    {
        if (value.n >= 0 && value.container)
            return value.container->elements.at(value.n);

        QtCbor::Element e;
        e.value = value.n;
        e.type = value.t;
        if (value.container) {
            e.container = value.container;
            e.flags = QtCbor::Element::IsContainer;
        }
        return e;
    }